

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

bool __thiscall dxil_spv::CFGStructurizer::rewrite_invalid_loop_breaks(CFGStructurizer *this)

{
  pointer ppCVar1;
  CFGNode *start_node;
  CFGNode *node;
  bool bVar2;
  uint32_t id;
  Id IVar3;
  CFGNode *to;
  Builder *pBVar4;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  *paVar6;
  ulong uVar7;
  size_t i;
  long lVar8;
  ulong uVar9;
  pointer ppCVar10;
  CFGNode *invalid_target;
  IncomingValue incoming;
  CFGNode *merge;
  CFGNode *local_c8;
  undefined1 local_c0 [24];
  undefined8 uStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  local_a0;
  void *local_90;
  iterator iStack_88;
  IncomingValue *local_80;
  undefined8 local_78;
  pointer pPStack_70;
  pointer local_68;
  pointer local_60;
  CFGNode *local_58;
  undefined1 local_50 [32];
  
  local_c8 = (CFGNode *)0x0;
  ppCVar10 = (this->forward_post_visit_order).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->forward_post_visit_order).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar10 != ppCVar1) {
    do {
      start_node = *ppCVar10;
      if ((((start_node->merge == Loop) && (start_node->freeze_structured_analysis == true)) &&
          (local_50._0_8_ = start_node->loop_merge_block,
          (CFGNode *)local_50._0_8_ != (CFGNode *)0x0)) &&
         (bVar2 = CFGNode::post_dominates((CFGNode *)local_50._0_8_,start_node), !bVar2)) {
        local_c0._0_8_ = local_50;
        local_c0._8_8_ = &local_c8;
        local_a0._8_8_ = 1;
        local_90 = (void *)0x0;
        iStack_88._M_current = (IncomingValue *)0x0;
        local_80 = (IncomingValue *)CONCAT44(local_80._4_4_,0x3f800000);
        local_78 = 0;
        pPStack_70 = (pointer)0x0;
        local_c0._16_8_ = this;
        local_a0._M_allocated_capacity = (size_type)&pPStack_70;
        CFGNode::
        traverse_dominated_blocks<dxil_spv::CFGStructurizer::rewrite_invalid_loop_breaks()::__0>
                  (start_node,(UnorderedSet<const_CFGNode_*> *)&local_a0,start_node,
                   (anon_class_24_3_8fce9826 *)local_c0);
        std::
        _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&local_a0);
        if (local_c8 != (CFGNode *)0x0) {
          node = start_node->loop_merge_block;
          to = create_helper_pred_block(this,node);
          start_node->loop_merge_block = to;
          local_60 = (to->pred).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_68 = (to->pred).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          traverse_dominated_blocks_and_rewrite_branch(this,start_node,local_c8,to);
          local_90 = (void *)0x0;
          iStack_88._M_current = (IncomingValue *)0x0;
          local_80 = (IncomingValue *)0x0;
          local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
          id = SPIRVModule::allocate_id(this->module);
          local_a0._M_allocated_capacity._0_4_ = id;
          pBVar4 = SPIRVModule::get_builder(this->module);
          IVar3 = spv::Builder::makeBoolType(pBVar4);
          local_a0._M_allocated_capacity._4_4_ = IVar3;
          pBVar4 = SPIRVModule::get_builder(this->module);
          local_50._0_8_ = local_50 + 0x10;
          std::__cxx11::
          basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                      *)local_50,"break_selector_","");
          local_58 = node;
          pbVar5 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                   ::_M_append((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                *)local_50,(node->name)._M_dataplus._M_p,
                               (node->name)._M_string_length);
          local_c0._0_8_ = (pbVar5->_M_dataplus)._M_p;
          paVar6 = &pbVar5->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_c0._0_8_ == paVar6) {
            local_c0._16_8_ = paVar6->_M_allocated_capacity;
            uStack_a8 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
            local_c0._0_8_ = (CFGNode *)(local_c0 + 0x10);
          }
          else {
            local_c0._16_8_ = paVar6->_M_allocated_capacity;
          }
          local_c0._8_8_ = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
          spv::Builder::addName(pBVar4,id,(char *)local_c0._0_8_);
          ppCVar10 = local_68;
          if ((CFGNode *)local_c0._0_8_ != (CFGNode *)(local_c0 + 0x10)) {
            free_in_thread((void *)local_c0._0_8_);
          }
          ppCVar1 = local_60;
          lVar8 = (long)ppCVar10 - (long)local_60;
          if ((CFGNode *)local_50._0_8_ != (CFGNode *)(local_50 + 0x10)) {
            free_in_thread((void *)local_50._0_8_);
          }
          uVar9 = lVar8 >> 3;
          if (ppCVar10 != ppCVar1) {
            lVar8 = 0;
            do {
              local_c0._8_8_ = local_c0._8_8_ & 0xffffffff00000000;
              local_c0._0_8_ =
                   (to->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar8];
              pBVar4 = SPIRVModule::get_builder(this->module);
              IVar3 = spv::Builder::makeBoolConstant(pBVar4,true,false);
              local_c0._8_4_ = IVar3;
              if (iStack_88._M_current == local_80) {
                std::
                vector<dxil_spv::IncomingValue,dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>>
                ::_M_realloc_insert<dxil_spv::IncomingValue_const&>
                          ((vector<dxil_spv::IncomingValue,dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>>
                            *)&local_90,iStack_88,(IncomingValue *)local_c0);
              }
              else {
                (iStack_88._M_current)->block = (CFGNode *)local_c0._0_8_;
                *(undefined8 *)&(iStack_88._M_current)->id = local_c0._8_8_;
                iStack_88._M_current = iStack_88._M_current + 1;
              }
              lVar8 = lVar8 + 1;
            } while (uVar9 + (uVar9 == 0) != lVar8);
          }
          uVar7 = (long)(to->pred).
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(to->pred).
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3;
          if (uVar9 < uVar7) {
            do {
              local_c0._8_8_ = local_c0._8_8_ & 0xffffffff00000000;
              local_c0._0_8_ =
                   (to->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9];
              pBVar4 = SPIRVModule::get_builder(this->module);
              IVar3 = spv::Builder::makeBoolConstant(pBVar4,false,false);
              local_c0._8_4_ = IVar3;
              if (iStack_88._M_current == local_80) {
                std::
                vector<dxil_spv::IncomingValue,dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>>
                ::_M_realloc_insert<dxil_spv::IncomingValue_const&>
                          ((vector<dxil_spv::IncomingValue,dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>>
                            *)&local_90,iStack_88,(IncomingValue *)local_c0);
              }
              else {
                (iStack_88._M_current)->block = (CFGNode *)local_c0._0_8_;
                *(undefined8 *)&(iStack_88._M_current)->id = local_c0._8_8_;
                iStack_88._M_current = iStack_88._M_current + 1;
              }
              uVar9 = uVar9 + 1;
            } while (uVar7 != uVar9);
          }
          (to->ir).terminator.type = Condition;
          (to->ir).terminator.true_block = local_58;
          (to->ir).terminator.false_block = local_c8;
          (to->ir).terminator.direct_block = (CFGNode *)0x0;
          (to->ir).terminator.conditional_id = local_a0._M_allocated_capacity._0_4_;
          std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::
          emplace_back<dxil_spv::PHI>(&(to->ir).phi,(PHI *)&local_a0);
          CFGNode::add_branch(to,local_c8);
          recompute_cfg(this);
          if (local_90 != (void *)0x0) {
            free_in_thread(local_90);
          }
          return true;
        }
      }
      ppCVar10 = ppCVar10 + 1;
    } while (ppCVar10 != ppCVar1);
  }
  return false;
}

Assistant:

bool CFGStructurizer::rewrite_invalid_loop_breaks()
{
	// Keep iterating here until we have validated a clean CFG w.r.t. block-like loops.
	// This should pass through first time without issue with extremely high probability,
	// so hitting the slow path isn't a real concern until proven otherwise.
	CFGNode *rewrite_header = nullptr;
	CFGNode *invalid_target = nullptr;

	// Process from inside out.
	for (auto *node : forward_post_visit_order)
	{
		// Structured loop constructs can end up with problematic merge scenarios where we missed
		// some cases where blocks branch outside our construct.
		// At some point, we were considered mere selection constructs and breaking out of it is fine,
		// but if the selection is promoted to a loop at some point after this analysis, we are a bit screwed.
		// This can happen in complex ladder resolve scenarios.
		// The fix-up means introducing multiple levels of ladder blocks.
		if (node->merge == MergeType::Loop && node->freeze_structured_analysis)
		{
			auto *merge = node->loop_merge_block;
			if (!merge || merge->post_dominates(node))
				continue;

			node->traverse_dominated_blocks([&](CFGNode *candidate) {
				if (candidate == merge || invalid_target)
					return false;

				// If the succ can reach outside the loop construct, we have an error condition.
				for (auto *succ : candidate->succ)
				{
					if (!query_reachability(*succ, *merge))
					{
						// Determine if we're an inner terminate/return, or a loop exit.
						// If the common post-dominator is EXIT node, this is a return-like relationship,
						// and we skip any fixup.
						auto *pdom = CFGNode::find_common_post_dominator(succ, merge);
						if (pdom != nullptr && !pdom->pred.empty())
							invalid_target = succ;
					}
				}
				return true;
			});

			if (invalid_target)
			{
				rewrite_header = node;
				break;
			}
		}
	}

	if (invalid_target)
	{
		auto *merge = rewrite_header->loop_merge_block;
		auto *dispatcher = create_helper_pred_block(merge);
		rewrite_header->loop_merge_block = dispatcher;

		size_t natural_preds = dispatcher->pred.size();
		traverse_dominated_blocks_and_rewrite_branch(rewrite_header, invalid_target, dispatcher);

		PHI phi;
		phi.id = module.allocate_id();
		phi.type_id = module.get_builder().makeBoolType();
		module.get_builder().addName(phi.id, (String("break_selector_") + merge->name).c_str());

		for (size_t i = 0; i < natural_preds; i++)
		{
			IncomingValue incoming = {};
			incoming.block = dispatcher->pred[i];
			incoming.id = module.get_builder().makeBoolConstant(true);
			phi.incoming.push_back(incoming);
		}

		for (size_t i = natural_preds, n = dispatcher->pred.size(); i < n; i++)
		{
			IncomingValue incoming = {};
			incoming.block = dispatcher->pred[i];
			incoming.id = module.get_builder().makeBoolConstant(false);
			phi.incoming.push_back(incoming);
		}

		dispatcher->ir.terminator.type = Terminator::Type::Condition;
		dispatcher->ir.terminator.true_block = merge;
		dispatcher->ir.terminator.false_block = invalid_target;
		dispatcher->ir.terminator.direct_block = nullptr;
		dispatcher->ir.terminator.conditional_id = phi.id;

		dispatcher->ir.phi.push_back(std::move(phi));
		dispatcher->add_branch(invalid_target);

		recompute_cfg();
		return true;
	}

	return false;
}